

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

int __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Dimension
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this)

{
  long lVar1;
  TPZCompEl **ppTVar2;
  int iVar3;
  TPZCompElSide *pTVar4;
  long lVar5;
  
  pTVar4 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore;
  lVar1 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
  lVar5 = 0;
  if (0 < lVar1) {
    lVar5 = lVar1;
  }
  lVar5 = lVar5 + 1;
  do {
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      return -1;
    }
    ppTVar2 = &pTVar4->fEl;
    pTVar4 = pTVar4 + 1;
  } while (*ppTVar2 == (TPZCompEl *)0x0);
  iVar3 = (**(code **)(*(long *)*ppTVar2 + 0xb0))();
  return iVar3;
}

Assistant:

int TPZMultiphysicsCompEl<TGeometry>::Dimension() const {
    for(int el = 0; el < fElementVec.NElements(); el++)
    {
        if(fElementVec[el])
        {
            return fElementVec[el].Element()->Dimension();
        }
    }
    return -1;
}